

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPoolTest_push_Test::TestBody(ThreadPoolTest_push_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1a8 [8];
  Message local_1a0 [8];
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  anon_class_8_1_351136f4 local_178;
  function<void_()> local_170;
  long local_150;
  size_t iteration___LINE____;
  thread_pool pool;
  atomic<unsigned_long> local_18;
  atomic<unsigned_long> iterations;
  ThreadPoolTest_push_Test *this_local;
  
  iterations.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)this;
  std::atomic<unsigned_long>::atomic(&local_18,0);
  jessilib::thread_pool::thread_pool((thread_pool *)&iteration___LINE____);
  for (local_150 = 0; local_150 != 100; local_150 = local_150 + 1) {
    local_178.iterations = &local_18;
    std::function<void()>::function<ThreadPoolTest_push_Test::TestBody()::__0,void>
              ((function<void()> *)&local_170,&local_178);
    jessilib::thread_pool::push(&iteration___LINE____,&local_170);
    std::function<void_()>::~function(&local_170);
  }
  jessilib::thread_pool::join();
  testing::internal::EqHelper::Compare<std::atomic<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"iterations","total_iterations",&local_18,&total_iterations);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  jessilib::thread_pool::~thread_pool((thread_pool *)&iteration___LINE____);
  return;
}

Assistant:

TEST(ThreadPoolTest, push) {
	std::atomic<size_t> iterations{0};
	thread_pool pool;

	repeat (total_iterations) {
		pool.push([&iterations]() {
			++iterations;
		});
	}

	pool.join();
	EXPECT_EQ(iterations, total_iterations);
}